

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O3

void Internal_DimStyleDefaultInit(ON_DimStyle *ds)

{
  ON_TextMask tm;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_60;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_5c;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_58;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_54;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_50;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_4c;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_48;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_44;
  ON_TextMask local_40;
  
  ON_DimStyle::SetExtExtension(ds,0.5);
  ON_DimStyle::SetExtOffset(ds,0.5);
  ON_DimStyle::SetArrowSize(ds,1.0);
  ON_DimStyle::SetLeaderArrowSize(ds,1.0);
  ON_DimStyle::SetCenterMark(ds,0.5);
  ON_DimStyle::SetCenterMarkStyle(ds,Mark);
  ON_DimStyle::SetTextGap(ds,0.25);
  ON_DimStyle::SetTextHeight(ds,1.0);
  ON_DimStyle::SetDimTextLocation(ds,AboveDimLine);
  ON_DimStyle::SetDimRadialTextLocation(ds,InDimLine);
  ON_DimStyle::SetAngleFormat(ds,DecimalDegrees);
  ON_DimStyle::SetAngleResolution(ds,2);
  ON_DimStyle::SetDimensionLengthDisplay(ds,ModelUnits);
  ON_DimStyle::SetAlternateDimensionLengthDisplay(ds,ModelUnits);
  ON_DimStyle::SetLengthResolution(ds,2);
  ON_DimStyle::SetAlternateLengthResolution(ds,2);
  ON_DimStyle::SetLengthFactor(ds,1.0);
  ON_DimStyle::SetAlternateLengthFactor(ds,1.0);
  ON_DimStyle::SetAlternate(ds,false);
  ON_DimStyle::SetForceDimLine(ds,true);
  ON_DimStyle::SetDecimalSeparator(ds,L'.');
  ON_DimStyle::SetPrefix(ds,L"");
  ON_DimStyle::SetSuffix(ds,L"");
  ON_DimStyle::SetAlternatePrefix(ds,L" [");
  ON_DimStyle::SetAlternateSuffix(ds,L"]");
  ON_DimStyle::SetDimExtension(ds,0.0);
  ON_DimStyle::SetSuppressExtension1(ds,false);
  ON_DimStyle::SetSuppressExtension2(ds,false);
  ON_DimStyle::SetToleranceFormat(ds,None);
  ON_DimStyle::SetToleranceResolution(ds,4);
  ON_DimStyle::SetToleranceUpperValue(ds,0.0);
  ON_DimStyle::SetToleranceLowerValue(ds,0.0);
  ON_DimStyle::SetToleranceHeightScale(ds,1.0);
  ON_DimStyle::SetBaselineSpacing(ds,3.0);
  local_40.m_bDrawMask = false;
  local_40.m_mask_type = BackgroundColor;
  local_40.m_mask_frame = NoFrame;
  local_40.m_reserved2 = '\0';
  local_40.m_mask_color.field_0 = ON_Color::White.field_0;
  local_40.m_mask_border = 0.0;
  local_40.m_reserved3 = 0;
  local_40.m_content_hash.m_digest[0] = ON_SHA1_Hash::ZeroDigest.m_digest[0];
  local_40.m_content_hash.m_digest[1] = ON_SHA1_Hash::ZeroDigest.m_digest[1];
  local_40.m_content_hash.m_digest[2] = ON_SHA1_Hash::ZeroDigest.m_digest[2];
  local_40.m_content_hash.m_digest[3] = ON_SHA1_Hash::ZeroDigest.m_digest[3];
  local_40.m_content_hash.m_digest[4] = ON_SHA1_Hash::ZeroDigest.m_digest[4];
  local_40.m_content_hash.m_digest[5] = ON_SHA1_Hash::ZeroDigest.m_digest[5];
  local_40.m_content_hash.m_digest[6] = ON_SHA1_Hash::ZeroDigest.m_digest[6];
  local_40.m_content_hash.m_digest[7] = ON_SHA1_Hash::ZeroDigest.m_digest[7];
  local_40.m_content_hash.m_digest[8] = ON_SHA1_Hash::ZeroDigest.m_digest[8];
  local_40.m_content_hash.m_digest[9] = ON_SHA1_Hash::ZeroDigest.m_digest[9];
  local_40.m_content_hash.m_digest[10] = ON_SHA1_Hash::ZeroDigest.m_digest[10];
  local_40.m_content_hash.m_digest[0xb] = ON_SHA1_Hash::ZeroDigest.m_digest[0xb];
  local_40.m_content_hash.m_digest[0xc] = ON_SHA1_Hash::ZeroDigest.m_digest[0xc];
  local_40.m_content_hash.m_digest[0xd] = ON_SHA1_Hash::ZeroDigest.m_digest[0xd];
  local_40.m_content_hash.m_digest[0xe] = ON_SHA1_Hash::ZeroDigest.m_digest[0xe];
  local_40.m_content_hash.m_digest[0xf] = ON_SHA1_Hash::ZeroDigest.m_digest[0xf];
  local_40.m_content_hash.m_digest[0x10] = ON_SHA1_Hash::ZeroDigest.m_digest[0x10];
  local_40.m_content_hash.m_digest[0x11] = ON_SHA1_Hash::ZeroDigest.m_digest[0x11];
  local_40.m_content_hash.m_digest[0x12] = ON_SHA1_Hash::ZeroDigest.m_digest[0x12];
  local_40.m_content_hash.m_digest[0x13] = ON_SHA1_Hash::ZeroDigest.m_digest[0x13];
  ON_DimStyle::SetTextMask(ds,&local_40);
  ON_DimStyle::SetDimScaleSource(ds,0);
  ON_DimStyle::SetExtensionLineColorSource(ds,color_from_layer);
  ON_DimStyle::SetDimensionLineColorSource(ds,color_from_layer);
  ON_DimStyle::SetArrowColorSource(ds,color_from_layer);
  ON_DimStyle::SetTextColorSource(ds,color_from_layer);
  ON_Color::ON_Color((ON_Color *)&local_44,0);
  ON_DimStyle::SetExtensionLineColor(ds,(ON_Color)local_44);
  ON_Color::ON_Color((ON_Color *)&local_48,0);
  ON_DimStyle::SetDimensionLineColor(ds,(ON_Color)local_48);
  ON_Color::ON_Color((ON_Color *)&local_4c,0);
  ON_DimStyle::SetArrowColor(ds,(ON_Color)local_4c);
  ON_Color::ON_Color((ON_Color *)&local_50,0);
  ON_DimStyle::SetTextColor(ds,(ON_Color)local_50);
  ON_DimStyle::SetExtensionLinePlotColorSource(ds,plot_color_from_layer);
  ON_DimStyle::SetDimensionLinePlotColorSource(ds,plot_color_from_layer);
  ON_DimStyle::SetArrowPlotColorSource(ds,plot_color_from_layer);
  ON_DimStyle::SetTextPlotColorSource(ds,color_from_layer);
  ON_Color::ON_Color((ON_Color *)&local_54,0);
  ON_DimStyle::SetExtensionLinePlotColor(ds,(ON_Color)local_54);
  ON_Color::ON_Color((ON_Color *)&local_58,0);
  ON_DimStyle::SetDimensionLinePlotColor(ds,(ON_Color)local_58);
  ON_Color::ON_Color((ON_Color *)&local_5c,0);
  ON_DimStyle::SetArrowPlotColor(ds,(ON_Color)local_5c);
  ON_Color::ON_Color((ON_Color *)&local_60,0);
  ON_DimStyle::SetTextPlotColor(ds,(ON_Color)local_60);
  ON_DimStyle::SetExtensionLinePlotWeightSource(ds,plot_weight_from_layer);
  ON_DimStyle::SetDimensionLinePlotWeightSource(ds,plot_weight_from_layer);
  ON_DimStyle::SetExtensionLinePlotWeight(ds,0.0);
  ON_DimStyle::SetDimensionLinePlotWeight(ds,0.0);
  ON_DimStyle::SetFixedExtensionLen(ds,1.0);
  ON_DimStyle::SetFixedExtensionLenOn(ds,false);
  ON_DimStyle::SetTextRotation(ds,0.0);
  ON_DimStyle::SetAlternateLengthResolution(ds,4);
  ON_DimStyle::SetToleranceHeightScale(ds,0.6);
  ON_DimStyle::SetSuppressArrow1(ds,false);
  ON_DimStyle::SetSuppressArrow2(ds,false);
  ON_DimStyle::SetTextMoveLeader(ds,0);
  ON_DimStyle::SetArcLengthSymbol(ds,0);
  ON_DimStyle::SetStackHeightScale(ds,0.7);
  ON_DimStyle::SetStackFractionFormat(ds,StackHorizontal);
  ON_DimStyle::SetAlternateRoundOff(ds,0.0);
  ON_DimStyle::SetRoundOff(ds,0.0);
  ON_DimStyle::SetAngleRoundOff(ds,0.0);
  ON_DimStyle::SetZeroSuppress(ds,None);
  ON_DimStyle::SetAlternateZeroSuppress(ds,None);
  ON_DimStyle::SetAngleZeroSuppress(ds,None);
  ON_DimStyle::SetAlternateBelow(ds,false);
  ON_DimStyle::SetArrowType1(ds,SolidTriangle);
  ON_DimStyle::SetArrowType2(ds,SolidTriangle);
  ON_DimStyle::SetLeaderArrowType(ds,SolidTriangle);
  ON_DimStyle::SetTextVerticalAlignment(ds,Top);
  ON_DimStyle::SetTextHorizontalAlignment(ds,Left);
  ON_DimStyle::SetLeaderTextVerticalAlignment(ds,MiddleOfTop);
  ON_DimStyle::SetLeaderTextHorizontalAlignment(ds,Left);
  ON_DimStyle::SetLeaderContentAngleStyle(ds,Horizontal);
  ON_DimStyle::SetLeaderCurveType(ds,Polyline);
  ON_DimStyle::SetLeaderContentAngleRadians(ds,0.0);
  ON_DimStyle::SetLeaderHasLanding(ds,false);
  ON_DimStyle::SetLeaderLandingLength(ds,1.0);
  ON_DimStyle::SetDrawForward(ds,true);
  ON_DimStyle::SetSignedOrdinate(ds,true);
  ON_DimStyle::SetDimScale(ds,1.0);
  ON_DimStyle::SetUnitSystem(ds,None);
  ON_DimStyle::SetTextOrientation(ds,InPlane);
  ON_DimStyle::SetLeaderTextOrientation(ds,InPlane);
  ON_DimStyle::SetDimTextOrientation(ds,InPlane);
  ON_DimStyle::SetDimRadialTextOrientation(ds,InPlane);
  ON_DimStyle::SetDimTextAngleStyle(ds,Aligned);
  ON_DimStyle::SetDimRadialTextAngleStyle(ds,Horizontal);
  ON_DimStyle::SetTextUnderlined(ds,false);
  return;
}

Assistant:

static void Internal_DimStyleDefaultInit(ON_DimStyle& ds)
{
  ds.SetExtExtension                     (0.5);
  ds.SetExtOffset                        (0.5);
  ds.SetArrowSize                        (1.0);
  ds.SetLeaderArrowSize                  (1.0);
  ds.SetCenterMark                       (0.5);
  ds.SetCenterMarkStyle                  (ON_DimStyle::centermark_style::Mark);
  ds.SetTextGap                          (0.25);
  ds.SetTextHeight                       (1.0);
  ds.SetDimTextLocation                  (ON_DimStyle::TextLocation::AboveDimLine);
  ds.SetDimRadialTextLocation            (ON_DimStyle::TextLocation::InDimLine);
  ds.SetAngleFormat                      (ON_DimStyle::angle_format::DecimalDegrees);
  ds.SetAngleResolution                  (2);
  ds.SetDimensionLengthDisplay           (ON_DimStyle::LengthDisplay::ModelUnits);
  ds.SetAlternateDimensionLengthDisplay  (ON_DimStyle::LengthDisplay::ModelUnits);
  ds.SetLengthResolution                 (2);
  ds.SetAlternateLengthResolution        (2);
  ds.SetLengthFactor                     (1.0);
  ds.SetAlternateLengthFactor            (1.0);
  ds.SetAlternate                        (false);
  ds.SetForceDimLine                     (true);
  ds.SetDecimalSeparator                 (L'.');
  ds.SetPrefix                           (L"");
  ds.SetSuffix                           (L"");
  ds.SetAlternatePrefix                  (L" [");
  ds.SetAlternateSuffix                  (L"]");
  ds.SetDimExtension                     (0.0);
  ds.SetSuppressExtension1               (false);
  ds.SetSuppressExtension2               (false);
  ds.SetToleranceFormat                  (ON_DimStyle::tolerance_format::None);
  ds.SetToleranceResolution              (4);
  ds.SetToleranceUpperValue              (0.0);
  ds.SetToleranceLowerValue              (0.0);
  ds.SetToleranceHeightScale             (1.0);
  ds.SetBaselineSpacing                  (3.0);
     ON_TextMask tm;
  ds.SetTextMask                         (tm);
  ds.SetDimScaleSource                   (0);
  ds.SetExtensionLineColorSource         (ON::object_color_source::color_from_layer);
  ds.SetDimensionLineColorSource         (ON::object_color_source::color_from_layer);
  ds.SetArrowColorSource                 (ON::object_color_source::color_from_layer);
  ds.SetTextColorSource                  (ON::object_color_source::color_from_layer);
  ds.SetExtensionLineColor               (ON_Color(0));
  ds.SetDimensionLineColor               (ON_Color(0));
  ds.SetArrowColor                       (ON_Color(0));
  ds.SetTextColor                        (ON_Color(0));
  ds.SetExtensionLinePlotColorSource     (ON::plot_color_source::plot_color_from_layer);
  ds.SetDimensionLinePlotColorSource     (ON::plot_color_source::plot_color_from_layer);
  ds.SetArrowPlotColorSource             (ON::plot_color_source::plot_color_from_layer);
  ds.SetTextPlotColorSource              (ON::object_color_source::color_from_layer);
  ds.SetExtensionLinePlotColor           (ON_Color(0));
  ds.SetDimensionLinePlotColor           (ON_Color(0));
  ds.SetArrowPlotColor                   (ON_Color(0));
  ds.SetTextPlotColor                    (ON_Color(0));
  ds.SetExtensionLinePlotWeightSource    (ON::plot_weight_source::plot_weight_from_layer);
  ds.SetDimensionLinePlotWeightSource    (ON::plot_weight_source::plot_weight_from_layer);
  ds.SetExtensionLinePlotWeight          (0.0);
  ds.SetDimensionLinePlotWeight          (0.0);
  ds.SetFixedExtensionLen                (1.0);
  ds.SetFixedExtensionLenOn              (false);
  ds.SetTextRotation                     (0.0);
  ds.SetAlternateLengthResolution        (4);
  ds.SetToleranceHeightScale             (0.6);
  ds.SetSuppressArrow1                   (false);
  ds.SetSuppressArrow2                   (false);
  ds.SetTextMoveLeader                   (0);
  ds.SetArcLengthSymbol                  (L'\0');
  ds.SetStackHeightScale                 (0.7);
  ds.SetStackFractionFormat              (ON_DimStyle::stack_format::StackHorizontal);
  ds.SetAlternateRoundOff                (0.0);
  ds.SetRoundOff                         (0.0);
  ds.SetAngleRoundOff                    (0.0);
  ds.SetZeroSuppress                     (ON_DimStyle::suppress_zero::None);
  ds.SetAlternateZeroSuppress            (ON_DimStyle::suppress_zero::None);
  ds.SetAngleZeroSuppress                (ON_DimStyle::suppress_zero::None);
  ds.SetAlternateBelow                   (false);
  ds.SetArrowType1                       (ON_Arrowhead::arrow_type::SolidTriangle);
  ds.SetArrowType2                       (ON_Arrowhead::arrow_type::SolidTriangle);
  ds.SetLeaderArrowType                  (ON_Arrowhead::arrow_type::SolidTriangle);
  ds.SetTextVerticalAlignment            (ON::TextVerticalAlignment::Top);
  ds.SetTextHorizontalAlignment          (ON::TextHorizontalAlignment::Left);
  ds.SetLeaderTextVerticalAlignment      (ON::TextVerticalAlignment::MiddleOfTop);
  ds.SetLeaderTextHorizontalAlignment    (ON::TextHorizontalAlignment::Left);
  ds.SetLeaderContentAngleStyle          (ON_DimStyle::ContentAngleStyle::Horizontal);
  ds.SetLeaderCurveType                  (ON_DimStyle::leader_curve_type::Polyline);
  ds.SetLeaderContentAngleRadians        (0.0);
  ds.SetLeaderHasLanding                 (false);
  ds.SetLeaderLandingLength              (1.0);
  ds.SetDrawForward                      (true);
  ds.SetSignedOrdinate                   (true);
  ds.SetDimScale                         (1.0);
  ds.SetUnitSystem                       (ON::LengthUnitSystem::None);
  ds.SetTextOrientation                  (ON::TextOrientation::InPlane);
  ds.SetLeaderTextOrientation            (ON::TextOrientation::InPlane);
  ds.SetDimTextOrientation               (ON::TextOrientation::InPlane);
  ds.SetDimRadialTextOrientation         (ON::TextOrientation::InPlane);
  ds.SetDimTextAngleStyle                (ON_DimStyle::ContentAngleStyle::Aligned);
  ds.SetDimRadialTextAngleStyle          (ON_DimStyle::ContentAngleStyle::Horizontal);
  ds.SetTextUnderlined                   (false);
}